

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O2

void Fx_ManUpdate(Fx_Man_t *p,int iDiv,int *fWarning)

{
  Vec_Int_t *p_00;
  Vec_Wec_t *pVVar1;
  Vec_Wec_t *pVVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Vec_Int_t *pVVar9;
  Vec_Int_t *pVVar10;
  Vec_Int_t *pVVar11;
  long lVar12;
  int t;
  int *piVar13;
  Vec_Int_t *pVVar14;
  int i;
  int iVar15;
  int iVar16;
  uint uVar17;
  int *piVar18;
  int *piVar19;
  long lVar20;
  int *piVar21;
  int *piVar22;
  int *piVar23;
  int *piVar24;
  float fVar25;
  float fVar26;
  int *in_stack_ffffffffffffff80;
  Vec_Int_t *local_68;
  Vec_Int_t *local_58;
  
  p_00 = p->vDiv;
  fVar25 = Vec_FltEntry(p->vWeights,iDiv);
  fVar26 = Vec_FltEntry(p->vWeights,iDiv);
  if ((fVar25 - (float)(int)fVar26 <= 0.0) || (1.0 <= fVar25 - (float)(int)fVar26)) {
    __assert_fail("Diff > 0.0 && Diff < 1.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                  ,0x3cb,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
  }
  p->nDivs = p->nDivs + 1;
  p_00->nSize = 0;
  pVVar9 = Hsh_VecReadEntry(p->pHash,iDiv);
  for (iVar15 = 0; iVar15 < pVVar9->nSize; iVar15 = iVar15 + 1) {
    iVar4 = Vec_IntEntry(pVVar9,iVar15);
    Vec_IntPush(p_00,iVar4);
  }
  iVar15 = -1;
  iVar4 = -1;
  for (iVar16 = 0; iVar16 < p_00->nSize; iVar16 = iVar16 + 1) {
    iVar5 = Vec_IntEntry(p_00,iVar16);
    iVar6 = Abc_LitIsCompl(iVar5);
    if (iVar6 == 0) {
      if (iVar15 != -1) goto LAB_0028ccb0;
      iVar15 = Abc_Lit2Var(iVar5);
LAB_0028ccc2:
      if (-1 < iVar4) break;
    }
    else {
      if (iVar4 == -1) {
        iVar4 = Abc_Lit2Var(iVar5);
      }
LAB_0028ccb0:
      if (-1 < iVar15) goto LAB_0028ccc2;
    }
  }
  if ((iVar15 < 0) || (iVar4 < 0)) {
    __assert_fail("Lit0 >= 0 && Lit1 >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                  ,0x3d2,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
  }
  p->vCubesS->nSize = 0;
  if (p_00->nSize == 2) {
    pVVar1 = p->vCubes;
    pVVar2 = p->vLits;
    iVar16 = Abc_LitNot(iVar15);
    pVVar9 = Vec_WecEntry(pVVar2,iVar16);
    Fx_ManCompressCubes(pVVar1,pVVar9);
    pVVar1 = p->vCubes;
    pVVar2 = p->vLits;
    iVar16 = Abc_LitNot(iVar4);
    pVVar9 = Vec_WecEntry(pVVar2,iVar16);
    Fx_ManCompressCubes(pVVar1,pVVar9);
    pVVar1 = p->vLits;
    iVar16 = Abc_LitNot(iVar15);
    pVVar10 = Vec_WecEntry(pVVar1,iVar16);
    pVVar1 = p->vLits;
    iVar16 = Abc_LitNot(iVar4);
    pVVar11 = Vec_WecEntry(pVVar1,iVar16);
    pVVar9 = p->vCubesS;
    piVar22 = pVVar10->pArray;
    piVar23 = pVVar11->pArray;
    piVar18 = piVar22 + pVVar10->nSize;
    iVar16 = pVVar11->nSize;
    pVVar9->nSize = 0;
    piVar3 = piVar23 + iVar16;
    piVar19 = piVar22;
    piVar24 = piVar22;
    piVar21 = piVar23;
    piVar13 = piVar23;
    while ((piVar22 < piVar18 && (piVar23 < piVar3))) {
      iVar16 = *piVar22;
      iVar5 = *piVar23;
      if (iVar16 == iVar5) {
        Vec_IntPush(pVVar9,iVar16);
        piVar22 = piVar22 + 1;
        piVar23 = piVar23 + 1;
        piVar19 = piVar24;
      }
      else if (iVar16 < iVar5) {
        piVar22 = piVar22 + 1;
        *piVar24 = iVar16;
        piVar19 = piVar19 + 1;
        piVar24 = piVar24 + 1;
      }
      else {
        piVar23 = piVar23 + 1;
        *piVar13 = iVar5;
        piVar13 = piVar13 + 1;
        piVar21 = piVar21 + 1;
        piVar19 = piVar24;
      }
    }
    for (lVar12 = 0; (int *)(lVar12 + (long)piVar22) < piVar18; lVar12 = lVar12 + 4) {
      *(int *)((long)piVar24 + lVar12) = *(int *)(lVar12 + (long)piVar22);
      piVar19 = piVar19 + 1;
    }
    for (lVar12 = 0; (int *)((long)piVar23 + lVar12) < piVar3; lVar12 = lVar12 + 4) {
      *(int *)((long)piVar13 + lVar12) = *(int *)((long)piVar23 + lVar12);
      piVar21 = piVar21 + 1;
    }
    Vec_IntShrink(pVVar10,(int)((ulong)((long)piVar19 - (long)pVVar10->pArray) >> 2));
    Vec_IntShrink(pVVar11,(int)((ulong)((long)piVar21 - (long)pVVar11->pArray) >> 2));
  }
  pVVar1 = p->vCubes;
  pVVar9 = Vec_WecEntry(p->vLits,iVar15);
  Fx_ManCompressCubes(pVVar1,pVVar9);
  pVVar1 = p->vCubes;
  pVVar9 = Vec_WecEntry(p->vLits,iVar4);
  Fx_ManCompressCubes(pVVar1,pVVar9);
  pVVar1 = p->vCubes;
  pVVar10 = Vec_WecEntry(p->vLits,iVar15);
  pVVar11 = Vec_WecEntry(p->vLits,iVar4);
  pVVar9 = p_00;
  Fx_ManFindCommonPairs
            (pVVar1,pVVar10,pVVar11,p->vCubesD,p->vCompls,p_00,p->vCubeFree,
             in_stack_ffffffffffffff80);
  for (iVar16 = 0; iVar16 < p->vCubesS->nSize; iVar16 = iVar16 + 1) {
    pVVar1 = p->vCubes;
    iVar5 = Vec_IntEntry(p->vCubesS,iVar16);
    pVVar10 = Vec_WecEntry(pVVar1,iVar5);
    if (pVVar10 == (Vec_Int_t *)0x0) break;
    Fx_ManCubeSingleCubeDivisors(p,pVVar10,1,1);
  }
  for (iVar16 = 0; iVar16 < p->vCubesD->nSize; iVar16 = iVar16 + 1) {
    pVVar1 = p->vCubes;
    iVar5 = Vec_IntEntry(p->vCubesD,iVar16);
    pVVar10 = Vec_WecEntry(pVVar1,iVar5);
    if (pVVar10 == (Vec_Int_t *)0x0) break;
    Fx_ManCubeSingleCubeDivisors(p,pVVar10,1,1);
  }
  Vec_WecMarkLevels(p->vCubes,p->vCubesS);
  Vec_WecMarkLevels(p->vCubes,p->vCubesD);
  for (iVar16 = 0; iVar16 < p->vCubesS->nSize; iVar16 = iVar16 + 1) {
    pVVar1 = p->vCubes;
    iVar5 = Vec_IntEntry(p->vCubesS,iVar16);
    pVVar10 = Vec_WecEntry(pVVar1,iVar5);
    if (pVVar10 == (Vec_Int_t *)0x0) break;
    iVar5 = Fx_ManGetFirstVarCube(p,pVVar10);
    Fx_ManCubeDoubleCubeDivisors(p,iVar5,pVVar10,1,1,&pVVar9->nCap);
  }
  for (iVar16 = 0; iVar16 < p->vCubesD->nSize; iVar16 = iVar16 + 1) {
    pVVar1 = p->vCubes;
    iVar5 = Vec_IntEntry(p->vCubesD,iVar16);
    pVVar10 = Vec_WecEntry(pVVar1,iVar5);
    if (pVVar10 == (Vec_Int_t *)0x0) break;
    iVar5 = Fx_ManGetFirstVarCube(p,pVVar10);
    Fx_ManCubeDoubleCubeDivisors(p,iVar5,pVVar10,1,1,&pVVar9->nCap);
  }
  Vec_WecUnmarkLevels(p->vCubes,p->vCubesS);
  Vec_WecUnmarkLevels(p->vCubes,p->vCubesD);
  iVar16 = Abc_Lit2Var(iVar15);
  iVar5 = Abc_Lit2Var(iVar4);
  if ((iVar16 == iVar5) && (pVVar10 = Hsh_VecReadEntry(p->pHash,iDiv), pVVar10->nSize == 2)) {
    local_58 = (Vec_Int_t *)0x0;
    local_68 = (Vec_Int_t *)0x0;
    iVar16 = 0;
  }
  else {
    iVar16 = p->vLits->nSize / 2;
    if (p->vVarCube->nSize != iVar16) {
      __assert_fail("Vec_IntSize(p->vVarCube) == iVarNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                    ,0x3fc,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
    }
    Vec_IntPush(p->vVarCube,p->vCubes->nSize);
    pVVar10 = Vec_WecPushLevel(p->vCubes);
    Vec_IntPush(pVVar10,iVar16);
    if (p_00->nSize == 2) {
      iVar5 = Abc_LitNot(iVar15);
      Vec_IntPush(pVVar10,iVar5);
      iVar5 = Abc_LitNot(iVar4);
      Vec_IntPush(pVVar10,iVar5);
      iVar5 = Fx_ManComputeLevelCube(p,pVVar10);
      iVar5 = iVar5 + 1;
    }
    else {
      pVVar10 = Vec_WecPushLevel(p->vCubes);
      pVVar11 = Vec_WecEntry(p->vCubes,p->vCubes->nSize + -2);
      Vec_IntPush(pVVar10,iVar16);
      for (iVar5 = 0; iVar5 < p_00->nSize; iVar5 = iVar5 + 1) {
        iVar6 = Vec_IntEntry(p_00,iVar5);
        iVar7 = Abc_LitIsCompl(iVar6);
        iVar6 = Abc_Lit2Var(iVar6);
        pVVar14 = pVVar10;
        if (iVar7 == 0) {
          pVVar14 = pVVar11;
        }
        Vec_IntPush(pVVar14,iVar6);
      }
      if ((p_00->nSize == 4) && (pVVar11->nSize == 3)) {
        if (pVVar10->nSize != 3) {
          __assert_fail("Vec_IntSize(vCube2) == 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                        ,0x2b3,"void Fx_ManDivAddLits(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
        }
        piVar3 = pVVar11->pArray;
        iVar5 = piVar3[1];
        if (piVar3[2] < iVar5) {
          piVar3[1] = piVar3[2];
          piVar3[2] = iVar5;
        }
        piVar3 = pVVar10->pArray;
        iVar5 = piVar3[1];
        if (piVar3[2] < iVar5) {
          piVar3[1] = piVar3[2];
          piVar3[2] = iVar5;
        }
      }
      iVar6 = Fx_ManComputeLevelCube(p,pVVar11);
      iVar5 = Fx_ManComputeLevelCube(p,pVVar10);
      if (iVar5 < iVar6) {
        iVar5 = iVar6;
      }
      iVar5 = iVar5 + 2;
    }
    if (p->vLevels->nSize != iVar16) {
      __assert_fail("Vec_IntSize(p->vLevels) == iVarNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                    ,0x40e,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
    }
    Vec_IntPush(p->vLevels,iVar5);
    p->nLits = p->nLits + p_00->nSize;
    Vec_WecPushLevel(p->vLits);
    local_58 = Vec_WecPushLevel(p->vLits);
    local_68 = Vec_WecEntry(p->vLits,p->vLits->nSize + -2);
    for (iVar5 = 0; iVar5 < p->vCubesS->nSize; iVar5 = iVar5 + 1) {
      pVVar1 = p->vCubes;
      iVar6 = Vec_IntEntry(p->vCubesS,iVar5);
      pVVar10 = Vec_WecEntry(pVVar1,iVar6);
      if (pVVar10 == (Vec_Int_t *)0x0) break;
      iVar6 = Abc_LitNot(iVar15);
      iVar6 = Vec_IntRemove1(pVVar10,iVar6);
      iVar7 = Abc_LitNot(iVar4);
      iVar7 = Vec_IntRemove1(pVVar10,iVar7);
      if (iVar7 + iVar6 != 2) {
        __assert_fail("RetValue == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                      ,0x41b,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
      }
      iVar6 = Abc_Var2Lit(iVar16,0);
      Vec_IntPush(pVVar10,iVar6);
      iVar6 = Vec_WecLevelId(p->vCubes,pVVar10);
      Vec_IntPush(local_68,iVar6);
      p->nLits = p->nLits + -1;
    }
  }
  p->nCompls = 0;
  pVVar10 = p->vCubesD;
  uVar17 = pVVar10->nSize;
  if ((uVar17 & 1) != 0) {
    __assert_fail("Vec_IntSize(p->vCubesD) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                  ,0x424,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
  }
  if (uVar17 != p->vCompls->nSize * 2) {
    __assert_fail("Vec_IntSize(p->vCubesD) == 2 * Vec_IntSize(p->vCompls)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                  ,0x425,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
  }
  iVar15 = 0;
  for (iVar4 = 0; iVar4 < (int)uVar17; iVar4 = iVar4 + 2) {
    iVar6 = Vec_IntEntry(p->vCompls,iVar15);
    p->nCompls = p->nCompls + iVar6;
    pVVar1 = p->vCubes;
    iVar5 = Vec_IntEntry(p->vCubesD,iVar4);
    pVVar10 = Vec_WecEntry(pVVar1,iVar5);
    pVVar1 = p->vCubes;
    iVar5 = Vec_IntEntry(p->vCubesD,iVar4 + 1);
    pVVar11 = Vec_WecEntry(pVVar1,iVar5);
    iVar7 = Fx_ManDivRemoveLits(pVVar10,p_00,iVar6);
    iVar8 = Fx_ManDivRemoveLits(pVVar11,p_00,iVar6);
    iVar5 = p_00->nSize;
    if ((iVar8 + iVar7 != iVar5) && (iVar8 + iVar7 != iVar5 + 1)) {
      __assert_fail("RetValue == Vec_IntSize(vDiv) || RetValue == Vec_IntSize( vDiv ) + 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                    ,0x42e,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
    }
    if (0 < iVar16) {
      pVVar14 = local_68;
      if (iVar6 != 0 || iVar5 == 2) {
        pVVar14 = local_58;
      }
      iVar5 = Abc_Var2Lit(iVar16,(uint)(iVar6 != 0 || iVar5 == 2));
      Vec_IntPush(pVVar10,iVar5);
      iVar5 = Vec_WecLevelId(p->vCubes,pVVar10);
      Vec_IntPush(pVVar14,iVar5);
    }
    p->nLits = (p->nLits - (p_00->nSize + pVVar11->nSize)) + 2;
    pVVar14 = p->vCubesD;
    iVar5 = Vec_WecLevelId(p->vCubes,pVVar10);
    Vec_IntWriteEntry(pVVar14,iVar15,iVar5);
    pVVar11->nSize = 0;
    pVVar10 = p->vCubesD;
    uVar17 = pVVar10->nSize;
    iVar15 = iVar15 + 1;
  }
  if ((int)uVar17 / 2 != iVar15) {
    __assert_fail("k == Vec_IntSize(p->vCubesD) / 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                  ,0x442,"void Fx_ManUpdate(Fx_Man_t *, int, int *)");
  }
  Vec_IntShrink(pVVar10,iVar15);
  Vec_IntSort(p->vCubesD,iVar15);
  for (iVar15 = 0; iVar15 < p->vCubesS->nSize; iVar15 = iVar15 + 1) {
    pVVar1 = p->vCubes;
    iVar4 = Vec_IntEntry(p->vCubesS,iVar15);
    pVVar10 = Vec_WecEntry(pVVar1,iVar4);
    if (pVVar10 == (Vec_Int_t *)0x0) break;
    Fx_ManCubeSingleCubeDivisors(p,pVVar10,0,1);
  }
  for (iVar15 = 0; iVar15 < p->vCubesD->nSize; iVar15 = iVar15 + 1) {
    pVVar1 = p->vCubes;
    iVar4 = Vec_IntEntry(p->vCubesD,iVar15);
    pVVar10 = Vec_WecEntry(pVVar1,iVar4);
    if (pVVar10 == (Vec_Int_t *)0x0) break;
    Fx_ManCubeSingleCubeDivisors(p,pVVar10,0,1);
  }
  Vec_WecMarkLevels(p->vCubes,p->vCubesS);
  Vec_WecMarkLevels(p->vCubes,p->vCubesD);
  for (iVar15 = 0; iVar15 < p->vCubesS->nSize; iVar15 = iVar15 + 1) {
    pVVar1 = p->vCubes;
    iVar4 = Vec_IntEntry(p->vCubesS,iVar15);
    pVVar10 = Vec_WecEntry(pVVar1,iVar4);
    if (pVVar10 == (Vec_Int_t *)0x0) break;
    iVar4 = Fx_ManGetFirstVarCube(p,pVVar10);
    Fx_ManCubeDoubleCubeDivisors(p,iVar4,pVVar10,0,1,&pVVar9->nCap);
  }
  iVar15 = 1;
  for (iVar4 = 0; iVar4 < p->vCubesD->nSize; iVar4 = iVar4 + 1) {
    pVVar1 = p->vCubes;
    iVar16 = Vec_IntEntry(p->vCubesD,iVar4);
    pVVar10 = Vec_WecEntry(pVVar1,iVar16);
    if (pVVar10 == (Vec_Int_t *)0x0) break;
    iVar16 = Fx_ManGetFirstVarCube(p,pVVar10);
    Fx_ManCubeDoubleCubeDivisors(p,iVar16,pVVar10,0,1,&pVVar9->nCap);
  }
  Vec_WecUnmarkLevels(p->vCubes,p->vCubesS);
  pVVar10 = p->vCubesD;
  Vec_WecUnmarkLevels(p->vCubes,pVVar10);
  pVVar11 = p->vSCC;
  if (pVVar11->nSize != 0) {
    if (1 < pVVar11->nSize) {
      Vec_IntSort(pVVar11,(int)pVVar10);
      for (lVar12 = 1; lVar12 < pVVar11->nSize; lVar12 = lVar12 + 1) {
        piVar3 = pVVar11->pArray;
        if (piVar3[lVar12] != piVar3[lVar12 + -1]) {
          lVar20 = (long)iVar15;
          iVar15 = iVar15 + 1;
          piVar3[lVar20] = piVar3[lVar12];
        }
      }
      pVVar11->nSize = iVar15;
    }
    for (iVar15 = 0; pVVar10 = p->vSCC, iVar15 < pVVar10->nSize; iVar15 = iVar15 + 1) {
      pVVar1 = p->vCubes;
      iVar4 = Vec_IntEntry(pVVar10,iVar15);
      pVVar10 = Vec_WecEntry(pVVar1,iVar4);
      if (pVVar10 == (Vec_Int_t *)0x0) {
        pVVar10 = p->vSCC;
        break;
      }
      iVar4 = Fx_ManGetFirstVarCube(p,pVVar10);
      Fx_ManCubeDoubleCubeDivisors(p,iVar4,pVVar10,1,1,&pVVar9->nCap);
      pVVar10->nSize = 0;
    }
    pVVar10->nSize = 0;
  }
  if (2 < p_00->nSize) {
    pVVar9 = Vec_WecEntry(p->vCubes,p->vCubes->nSize + -2);
    pVVar10 = Vec_WecEntry(p->vCubes,p->vCubes->nSize + -1);
    Fx_ManCubeSingleCubeDivisors(p,pVVar9,0,1);
    Fx_ManCubeSingleCubeDivisors(p,pVVar10,0,1);
    for (iVar15 = 1; iVar15 < pVVar9->nSize; iVar15 = iVar15 + 1) {
      iVar4 = Vec_IntEntry(pVVar9,iVar15);
      pVVar1 = p->vLits;
      iVar16 = Vec_WecLevelId(p->vCubes,pVVar9);
      Vec_WecPush(pVVar1,iVar4,iVar16);
    }
    for (iVar15 = 1; iVar15 < pVVar10->nSize; iVar15 = iVar15 + 1) {
      iVar4 = Vec_IntEntry(pVVar10,iVar15);
      pVVar1 = p->vLits;
      iVar16 = Vec_WecLevelId(p->vCubes,pVVar10);
      Vec_WecPush(pVVar1,iVar4,iVar16);
    }
  }
  for (uVar17 = 0; (int)uVar17 < p_00->nSize; uVar17 = uVar17 + 1) {
    iVar15 = Vec_IntEntry(p_00,uVar17);
    pVVar1 = p->vLits;
    iVar4 = Abc_Lit2Var(iVar15);
    pVVar9 = Vec_WecEntry(pVVar1,iVar4);
    Vec_IntTwoRemove(pVVar9,p->vCubesD);
    if (((1 < uVar17) && (p->nCompls != 0)) || (p_00->nSize == 2)) {
      pVVar1 = p->vLits;
      iVar15 = Abc_Lit2Var(iVar15);
      iVar15 = Abc_LitNot(iVar15);
      pVVar9 = Vec_WecEntry(pVVar1,iVar15);
      Vec_IntTwoRemove(pVVar9,p->vCubesD);
    }
  }
  return;
}

Assistant:

void Fx_ManUpdate( Fx_Man_t * p, int iDiv, int * fWarning )
{
    Vec_Int_t * vCube, * vCube2, * vLitP = NULL, * vLitN = NULL;
    Vec_Int_t * vDiv = p->vDiv;
    int i, k, Lit0, Lit1, iVarNew = 0, RetValue, Level;
    float Diff = Vec_FltEntry(p->vWeights, iDiv) - (float)((int)Vec_FltEntry(p->vWeights, iDiv));
    assert( Diff > 0.0 && Diff < 1.0 );

    // get the divisor and select pivot variables
    p->nDivs++;
    Vec_IntClear( vDiv );
    Vec_IntAppend( vDiv, Hsh_VecReadEntry(p->pHash, iDiv) );
    Fx_ManDivFindPivots( vDiv, &Lit0, &Lit1 );
    assert( Lit0 >= 0 && Lit1 >= 0 );


    // collect single-cube-divisor cubes
    Vec_IntClear( p->vCubesS );
    if ( Vec_IntSize(vDiv) == 2 )
    {
        Fx_ManCompressCubes( p->vCubes, Vec_WecEntry(p->vLits, Abc_LitNot(Lit0)) );
        Fx_ManCompressCubes( p->vCubes, Vec_WecEntry(p->vLits, Abc_LitNot(Lit1)) );
        Vec_IntTwoRemoveCommon( Vec_WecEntry(p->vLits, Abc_LitNot(Lit0)), Vec_WecEntry(p->vLits, Abc_LitNot(Lit1)), p->vCubesS );
    }

    // collect double-cube-divisor cube pairs
    Fx_ManCompressCubes( p->vCubes, Vec_WecEntry(p->vLits, Lit0) );
    Fx_ManCompressCubes( p->vCubes, Vec_WecEntry(p->vLits, Lit1) );
    Fx_ManFindCommonPairs( p->vCubes, Vec_WecEntry(p->vLits, Lit0), Vec_WecEntry(p->vLits, Lit1), p->vCubesD, p->vCompls, vDiv, p->vCubeFree, fWarning );

    // subtract cost of single-cube divisors
    Fx_ManForEachCubeVec( p->vCubesS, p->vCubes, vCube, i )
        Fx_ManCubeSingleCubeDivisors( p, vCube, 1, 1 );  // remove - update
    Fx_ManForEachCubeVec( p->vCubesD, p->vCubes, vCube, i )
        Fx_ManCubeSingleCubeDivisors( p, vCube, 1, 1 );  // remove - update

    // mark the cubes to be removed
    Vec_WecMarkLevels( p->vCubes, p->vCubesS );
    Vec_WecMarkLevels( p->vCubes, p->vCubesD );

    // subtract cost of double-cube divisors
    Fx_ManForEachCubeVec( p->vCubesS, p->vCubes, vCube, i )
        Fx_ManCubeDoubleCubeDivisors( p, Fx_ManGetFirstVarCube(p, vCube), vCube, 1, 1, fWarning );  // remove - update
    Fx_ManForEachCubeVec( p->vCubesD, p->vCubes, vCube, i )
        Fx_ManCubeDoubleCubeDivisors( p, Fx_ManGetFirstVarCube(p, vCube), vCube, 1, 1, fWarning );  // remove - update

    // unmark the cubes to be removed
    Vec_WecUnmarkLevels( p->vCubes, p->vCubesS );
    Vec_WecUnmarkLevels( p->vCubes, p->vCubesD );

    if ( Abc_Lit2Var(Lit0) == Abc_Lit2Var(Lit1) && Vec_IntSize(Hsh_VecReadEntry(p->pHash, iDiv)) == 2 )
        goto ExtractFromPairs;

    // create new divisor
    iVarNew = Vec_WecSize( p->vLits ) / 2;
    assert( Vec_IntSize(p->vVarCube) == iVarNew );
    Vec_IntPush( p->vVarCube, Vec_WecSize(p->vCubes) );
    vCube = Vec_WecPushLevel( p->vCubes );
    Vec_IntPush( vCube, iVarNew );
    if ( Vec_IntSize(vDiv) == 2 )
    {
        Vec_IntPush( vCube, Abc_LitNot(Lit0) );
        Vec_IntPush( vCube, Abc_LitNot(Lit1) );
        Level = 1 + Fx_ManComputeLevelCube( p, vCube );
    }
    else
    {
        vCube2 = Vec_WecPushLevel( p->vCubes );
        vCube = Vec_WecEntry( p->vCubes, Vec_WecSize(p->vCubes) - 2 );
        Vec_IntPush( vCube2, iVarNew );
        Fx_ManDivAddLits( vCube, vCube2, vDiv );
        Level = 2 + Abc_MaxInt( Fx_ManComputeLevelCube(p, vCube), Fx_ManComputeLevelCube(p, vCube2) );
    }
    assert( Vec_IntSize(p->vLevels) == iVarNew );
    Vec_IntPush( p->vLevels, Level );
    // do not add new cubes to the matrix 
    p->nLits += Vec_IntSize( vDiv );
    // create new literals
    vLitP = Vec_WecPushLevel( p->vLits );
    vLitN = Vec_WecPushLevel( p->vLits );
    vLitP = Vec_WecEntry( p->vLits, Vec_WecSize(p->vLits) - 2 );
    // create updated single-cube divisor cubes
    Fx_ManForEachCubeVec( p->vCubesS, p->vCubes, vCube, i )
    {
        RetValue  = Vec_IntRemove1( vCube, Abc_LitNot(Lit0) );
        RetValue += Vec_IntRemove1( vCube, Abc_LitNot(Lit1) );
        assert( RetValue == 2 );
        Vec_IntPush( vCube, Abc_Var2Lit(iVarNew, 0) );
        Vec_IntPush( vLitP, Vec_WecLevelId(p->vCubes, vCube) );
        p->nLits--;
    }
    // create updated double-cube divisor cube pairs
ExtractFromPairs:
    k = 0;
    p->nCompls = 0;
    assert( Vec_IntSize(p->vCubesD) % 2 == 0 );
    assert( Vec_IntSize(p->vCubesD) == 2 * Vec_IntSize(p->vCompls) );
    for ( i = 0; i < Vec_IntSize(p->vCubesD); i += 2 )
    {
        int fCompl = Vec_IntEntry(p->vCompls, i/2);
        p->nCompls += fCompl;
        vCube  = Vec_WecEntry( p->vCubes, Vec_IntEntry(p->vCubesD, i) );
        vCube2 = Vec_WecEntry( p->vCubes, Vec_IntEntry(p->vCubesD, i+1) );
        RetValue  = Fx_ManDivRemoveLits( vCube, vDiv, fCompl );  // cube 2*i
        RetValue += Fx_ManDivRemoveLits( vCube2, vDiv, fCompl ); // cube 2*i+1
        assert( RetValue == Vec_IntSize(vDiv) || RetValue == Vec_IntSize( vDiv ) + 1);
        if ( iVarNew > 0 )
        {
            if ( Vec_IntSize(vDiv) == 2 || fCompl )
            {
                Vec_IntPush( vCube, Abc_Var2Lit(iVarNew, 1) );
                Vec_IntPush( vLitN, Vec_WecLevelId(p->vCubes, vCube) ); // MAKE SURE vCube IS SORTED BY ID
            }
            else 
            {
                Vec_IntPush( vCube, Abc_Var2Lit(iVarNew, 0) );
                Vec_IntPush( vLitP, Vec_WecLevelId(p->vCubes, vCube) ); // MAKE SURE vCube IS SORTED BY ID
            }
        }
        p->nLits -= Vec_IntSize(vDiv) + Vec_IntSize(vCube2) - 2;

        // remove second cube
        Vec_IntWriteEntry( p->vCubesD, k++, Vec_WecLevelId(p->vCubes, vCube) );
        Vec_IntClear( vCube2 ); 
    }
    assert( k == Vec_IntSize(p->vCubesD) / 2 );
    Vec_IntShrink( p->vCubesD, k );
    Vec_IntSort( p->vCubesD, 0 );
    //Vec_IntSort( vLitN, 0 );
    //Vec_IntSort( vLitP, 0 );

    // add cost of single-cube divisors
    Fx_ManForEachCubeVec( p->vCubesS, p->vCubes, vCube, i )
        Fx_ManCubeSingleCubeDivisors( p, vCube, 0, 1 );  // add - update
    Fx_ManForEachCubeVec( p->vCubesD, p->vCubes, vCube, i )
        Fx_ManCubeSingleCubeDivisors( p, vCube, 0, 1 );  // add - update

    // mark the cubes to be removed
    Vec_WecMarkLevels( p->vCubes, p->vCubesS );
    Vec_WecMarkLevels( p->vCubes, p->vCubesD );

    // add cost of double-cube divisors
    Fx_ManForEachCubeVec( p->vCubesS, p->vCubes, vCube, i )
        Fx_ManCubeDoubleCubeDivisors( p, Fx_ManGetFirstVarCube(p, vCube), vCube, 0, 1, fWarning );  // add - update
    Fx_ManForEachCubeVec( p->vCubesD, p->vCubes, vCube, i )
        Fx_ManCubeDoubleCubeDivisors( p, Fx_ManGetFirstVarCube(p, vCube), vCube, 0, 1, fWarning );  // add - update

    // unmark the cubes to be removed
    Vec_WecUnmarkLevels( p->vCubes, p->vCubesS );
    Vec_WecUnmarkLevels( p->vCubes, p->vCubesD );

    // Deal with SCC
    if ( Vec_IntSize( p->vSCC ) )
    {
        Vec_IntUniqify( p->vSCC );
        Fx_ManForEachCubeVec( p->vSCC, p->vCubes, vCube, i )
        {
            Fx_ManCubeDoubleCubeDivisors( p, Fx_ManGetFirstVarCube(p, vCube), vCube, 1, 1, fWarning );  // remove - update
            Vec_IntClear( vCube );
        }
        Vec_IntClear( p->vSCC );
    }
    // add cost of the new divisor
    if ( Vec_IntSize(vDiv) > 2 )
    {
        vCube  = Vec_WecEntry( p->vCubes, Vec_WecSize(p->vCubes) - 2 );
        vCube2 = Vec_WecEntry( p->vCubes, Vec_WecSize(p->vCubes) - 1 );
        Fx_ManCubeSingleCubeDivisors( p, vCube,  0, 1 );  // add - update
        Fx_ManCubeSingleCubeDivisors( p, vCube2, 0, 1 );  // add - update
        Vec_IntForEachEntryStart( vCube, Lit0, i, 1 )
            Vec_WecPush( p->vLits, Lit0, Vec_WecLevelId(p->vCubes, vCube) );
        Vec_IntForEachEntryStart( vCube2, Lit0, i, 1 )
            Vec_WecPush( p->vLits, Lit0, Vec_WecLevelId(p->vCubes, vCube2) );
    }

    // remove these cubes from the lit array of the divisor
    Vec_IntForEachEntry( vDiv, Lit0, i )
    {
        Vec_IntTwoRemove( Vec_WecEntry(p->vLits, Abc_Lit2Var(Lit0)), p->vCubesD );
        if ( (p->nCompls && i > 1) || Vec_IntSize( vDiv ) == 2 ) // the last two lits are possibly complemented
            Vec_IntTwoRemove( Vec_WecEntry(p->vLits, Abc_LitNot(Abc_Lit2Var(Lit0))), p->vCubesD );
    }

}